

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

enable_if_t<std::is_base_of<interface_type,_std::decay_t<Impl2T<delegate_cloning_policy<Interface,_allocator<Interface>,_integral_constant<bool,_true>_>_>_&>_>::value,_void>
 __thiscall
poly::
vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
::
push_back<Impl2T<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>&>
          (vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
           *this,Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                 *obj)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  long v_2;
  long lVar4;
  long v;
  long lVar5;
  long v_1;
  Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
  *this_00;
  
  lVar1 = *(long *)(this + 0x10);
  lVar4 = *(long *)(this + 0x18);
  if ((lVar1 != lVar4) && (uVar2 = *(ulong *)(this + 0x20), 0x3f < uVar2)) {
    lVar5 = lVar4;
    if (lVar1 != *(long *)this) {
      lVar5 = *(long *)(lVar1 + -0x20) + *(long *)(lVar1 + -0x10);
    }
    if ((uVar2 - ((uVar2 + lVar5) - 1) % uVar2) + lVar5 + 0xff <= *(ulong *)(this + 8)) {
      if ((lVar1 != lVar4) && (uVar2 = *(ulong *)(this + 0x20), 0x3f < uVar2)) {
        lVar5 = lVar4;
        if (lVar1 != *(long *)this) {
          lVar5 = *(long *)(lVar1 + -0x20) + *(long *)(lVar1 + -0x10);
        }
        if ((uVar2 - ((uVar2 + lVar5) - 1) % uVar2) + lVar5 + 0xff <= *(ulong *)(this + 8)) {
          if (lVar1 != *(long *)this) {
            lVar4 = *(long *)(lVar1 + -0x20) + *(long *)(lVar1 + -0x10);
          }
          this_00 = (Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                     *)(((uVar2 - 1) - ((uVar2 - 1) + lVar4) % uVar2) + lVar4);
          Impl2T<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
          ::Impl2T(this_00,obj);
          puVar3 = *(undefined8 **)(this + 0x10);
          *puVar3 = delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>
                    ::
                    clone_func<Impl2T<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>>
          ;
          puVar3[1] = this_00;
          puVar3[2] = this_00;
          puVar3[3] = 0x100;
          puVar3[4] = 0x40;
          *(long *)(this + 0x10) = *(long *)(this + 0x10) + 0x28;
          return;
        }
      }
      __assert_fail("can_construct_new_elem(s, a)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                    ,0x5a9,
                    "void poly::vector<Interface>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = std::allocator<Interface>, CloningPolicy = poly::delegate_cloning_policy<Interface>, T = Impl2T<poly::delegate_cloning_policy<Interface>>, Args = <Impl2T<poly::delegate_cloning_policy<Interface>> &>]"
                   );
    }
  }
  push_back_new_elem_w_storage_increase<Impl2T<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>,Impl2T<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>&>
            (this);
  return;
}

Assistant:

inline auto vector<I, A, C>::push_back(T&& obj)
    -> std::enable_if_t<std::is_base_of<interface_type, std::decay_t<T>>::value>
{
    using TT         = std::decay_t<T>;
    constexpr auto s = sizeof(TT);
    constexpr auto a = alignof(TT);
    if (!can_construct_new_elem(s, a)) {
        push_back_new_elem_w_storage_increase(type_tag<TT> {}, std::forward<T>(obj));
    } else {
        push_back_new_elem(type_tag<TT> {}, std::forward<T>(obj));
    }
}